

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

bool __thiscall
libcellml::Variable::VariableImpl::unsetEquivalentTo
          (VariableImpl *this,VariablePtr *equivalentVariable)

{
  weak_ptr<libcellml::Variable> *pwVar1;
  iterator __position;
  iterator iVar2;
  __weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  cleanExpiredVariables(this);
  __position = findEquivalentVariable(this,equivalentVariable);
  pwVar1 = (this->mEquivalentVariables).
           super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != pwVar1) {
    std::
    vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
    ::erase(&this->mEquivalentVariables,(const_iterator)__position._M_current);
    std::__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libcellml::Variable,void>
              (local_40,&equivalentVariable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
    iVar2 = std::
            _Rb_tree<std::weak_ptr<libcellml::Variable>,_std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->mMappingIdMap)._M_t,(key_type *)local_40);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->mMappingIdMap)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::weak_ptr<libcellml::Variable>,std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>,std::_Select1st<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>,std::owner_less<std::weak_ptr<libcellml::Variable>>,std::allocator<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>>
      ::erase_abi_cxx11_((_Rb_tree<std::weak_ptr<libcellml::Variable>,std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>,std::_Select1st<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>,std::owner_less<std::weak_ptr<libcellml::Variable>>,std::allocator<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>>
                          *)&this->mMappingIdMap,iVar2);
    }
    std::__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libcellml::Variable,void>
              (local_40,&equivalentVariable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
    iVar2 = std::
            _Rb_tree<std::weak_ptr<libcellml::Variable>,_std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->mConnectionIdMap)._M_t,(key_type *)local_40);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->mConnectionIdMap)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::weak_ptr<libcellml::Variable>,std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>,std::_Select1st<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>,std::owner_less<std::weak_ptr<libcellml::Variable>>,std::allocator<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>>
      ::erase_abi_cxx11_((_Rb_tree<std::weak_ptr<libcellml::Variable>,std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>,std::_Select1st<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>,std::owner_less<std::weak_ptr<libcellml::Variable>>,std::allocator<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>>
                          *)&this->mConnectionIdMap,iVar2);
    }
  }
  return __position._M_current != pwVar1;
}

Assistant:

bool Variable::VariableImpl::unsetEquivalentTo(const VariablePtr &equivalentVariable)
{
    cleanExpiredVariables();
    bool status = false;
    auto result = findEquivalentVariable(equivalentVariable);
    if (result != mEquivalentVariables.end()) {
        mEquivalentVariables.erase(result);
        auto mappingIdResult = mMappingIdMap.find(equivalentVariable);
        if (mappingIdResult != mMappingIdMap.end()) {
            mMappingIdMap.erase(mappingIdResult);
        }
        auto connectionIdResult = mConnectionIdMap.find(equivalentVariable);
        if (connectionIdResult != mConnectionIdMap.end()) {
            mConnectionIdMap.erase(connectionIdResult);
        }
        status = true;
    }

    return status;
}